

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

int64_t TPZSkylMatrix<double>::NumElements(TPZVec<long> *skyline)

{
  int64_t iVar1;
  long *plVar2;
  TPZVec<long> *in_RDI;
  int64_t nelem;
  int64_t i;
  int64_t dim;
  undefined8 local_20;
  undefined8 local_18;
  
  iVar1 = TPZVec<long>::NElements(in_RDI);
  local_20 = 0;
  for (local_18 = 0; local_18 < iVar1; local_18 = local_18 + 1) {
    plVar2 = TPZVec<long>::operator[](in_RDI,local_18);
    local_20 = (local_18 - *plVar2) + 1 + local_20;
  }
  return local_20;
}

Assistant:

int64_t TPZSkylMatrix<TVar>::NumElements(const TPZVec<int64_t> &skyline) {
	int64_t dim = skyline.NElements();
	int64_t i;
	int64_t nelem=0;
	for(i=0; i<dim; i++) {
		nelem += i-skyline[i]+1;
	}
	return nelem;
}